

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  uint out_shift_00;
  uint bd_00;
  uint do_cols_00;
  uint uVar3;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  __m256i bf1 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rounding;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospim32;
  __m256i cospi32;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospim8;
  __m256i cospim40;
  __m256i cospi8;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospi56;
  __m256i cospim36;
  __m256i cospim52;
  __m256i cospi4;
  __m256i cospi20;
  __m256i cospi12;
  __m256i cospi44;
  __m256i cospi28;
  __m256i cospi60;
  __m256i cospim34;
  __m256i cospim50;
  __m256i cospim42;
  __m256i cospim58;
  __m256i cospi2;
  __m256i cospi18;
  __m256i cospi10;
  __m256i cospi26;
  __m256i cospi6;
  __m256i cospi38;
  __m256i cospi22;
  __m256i cospi54;
  __m256i cospi14;
  __m256i cospi46;
  __m256i cospi30;
  __m256i cospi62;
  int32_t *cospi;
  __m256i *palVar4;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffeab8;
  __m256i *cospim24_00;
  undefined4 in_stack_ffffffffffffeac0;
  int iVar6;
  undefined4 in_stack_ffffffffffffeac4;
  int in_stack_ffffffffffffeac8;
  undefined4 in_stack_ffffffffffffeacc;
  __m256i *in_stack_ffffffffffffead0;
  __m256i *in_stack_ffffffffffffead8;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 local_1080 [16];
  undefined1 auStack_1070 [16];
  longlong local_1060;
  longlong lStack_1058;
  longlong lStack_1050;
  longlong lStack_1048;
  int local_1024;
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  longlong local_f40;
  longlong lStack_f38;
  longlong lStack_f30;
  longlong lStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  longlong local_ea0;
  longlong lStack_e98;
  longlong lStack_e90;
  longlong lStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  int32_t *local_b30;
  int local_b24;
  int local_b20;
  int local_b1c;
  uint local_b04;
  uint local_b00;
  uint local_afc;
  uint local_af8;
  uint local_af4;
  uint local_af0;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  uint local_ae0;
  uint local_adc;
  uint local_ad8;
  uint local_ad4;
  uint local_ad0;
  uint local_acc;
  uint local_ac8;
  uint local_ac4;
  uint local_ac0;
  uint local_abc;
  uint local_ab8;
  uint local_ab4;
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  uint local_a88;
  uint local_a84;
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  uint local_a74;
  uint local_a70;
  uint local_a6c;
  uint local_a68;
  uint local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  uint local_a30;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  uint local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  uint local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  uint local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  uint local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  uint local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  uint local_92c;
  uint local_928;
  uint local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  uint local_8ec;
  uint local_8e8;
  uint local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  uint local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  uint local_8ac;
  uint local_8a8;
  uint local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  uint local_880;
  uint local_87c;
  uint local_878;
  uint local_874;
  uint local_870;
  uint local_86c;
  uint local_868;
  uint local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  uint local_840;
  uint local_83c;
  uint local_838;
  uint local_834;
  uint local_830;
  uint local_82c;
  uint local_828;
  uint local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  uint local_7c0;
  uint local_7bc;
  uint local_7b8;
  uint local_7b4;
  uint local_7b0;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  uint local_780;
  uint local_77c;
  uint local_778;
  uint local_774;
  uint local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  uint local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  uint local_700;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  uint local_6f0;
  uint local_6ec;
  uint local_6e8;
  uint local_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  uint local_6c0;
  uint local_6bc;
  uint local_6b8;
  uint local_6b4;
  uint local_6b0;
  uint local_6ac;
  uint local_6a8;
  uint local_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  uint local_680;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  uint local_668;
  uint local_664;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  uint local_640;
  uint local_63c;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  uint local_628;
  uint local_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  uint local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  uint local_5c0;
  uint local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  uint local_580;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  uint local_540;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  uint local_524;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  undefined1 local_e0 [32];
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined1 local_60 [32];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffeab8 >> 0x20);
  local_b24 = in_R8D;
  local_b20 = in_ECX;
  local_b1c = in_EDX;
  local_b30 = cospi_arr(in_EDX);
  uVar8 = local_b30[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  local_a60 = vpinsrd_avx(auVar1,uVar8,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  auStack_a50 = vpinsrd_avx(auVar1,uVar8,3);
  local_b60 = local_a60._0_8_;
  uStack_b58 = local_a60._8_8_;
  uStack_b50 = auStack_a50._0_8_;
  uStack_b48 = auStack_a50._8_8_;
  uVar9 = local_b30[0x1e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  local_a20 = vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  auStack_a10 = vpinsrd_avx(auVar1,uVar9,3);
  local_b80 = local_a20._0_8_;
  uStack_b78 = local_a20._8_8_;
  uStack_b70 = auStack_a10._0_8_;
  uStack_b68 = auStack_a10._8_8_;
  uVar10 = local_b30[0x2e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar1 = vpinsrd_avx(auVar1,uVar10,2);
  local_9e0 = vpinsrd_avx(auVar1,uVar10,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar1 = vpinsrd_avx(auVar1,uVar10,2);
  auStack_9d0 = vpinsrd_avx(auVar1,uVar10,3);
  local_ba0 = local_9e0._0_8_;
  uStack_b98 = local_9e0._8_8_;
  uStack_b90 = auStack_9d0._0_8_;
  uStack_b88 = auStack_9d0._8_8_;
  uVar11 = local_b30[0xe];
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  local_9a0 = vpinsrd_avx(auVar1,uVar11,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar1 = vpinsrd_avx(auVar1,uVar11,2);
  auStack_990 = vpinsrd_avx(auVar1,uVar11,3);
  local_bc0 = local_9a0._0_8_;
  uStack_bb8 = local_9a0._8_8_;
  uStack_bb0 = auStack_990._0_8_;
  uStack_ba8 = auStack_990._8_8_;
  uVar12 = local_b30[0x36];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  local_960 = vpinsrd_avx(auVar1,uVar12,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  auStack_950 = vpinsrd_avx(auVar1,uVar12,3);
  local_be0 = local_960._0_8_;
  uStack_bd8 = local_960._8_8_;
  uStack_bd0 = auStack_950._0_8_;
  uStack_bc8 = auStack_950._8_8_;
  uVar13 = local_b30[0x16];
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  local_920 = vpinsrd_avx(auVar1,uVar13,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  auStack_910 = vpinsrd_avx(auVar1,uVar13,3);
  local_c00 = local_920._0_8_;
  uStack_bf8 = local_920._8_8_;
  uStack_bf0 = auStack_910._0_8_;
  uStack_be8 = auStack_910._8_8_;
  uVar14 = local_b30[0x26];
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  local_8e0 = vpinsrd_avx(auVar1,uVar14,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  auStack_8d0 = vpinsrd_avx(auVar1,uVar14,3);
  local_c20 = local_8e0._0_8_;
  uStack_c18 = local_8e0._8_8_;
  uStack_c10 = auStack_8d0._0_8_;
  uStack_c08 = auStack_8d0._8_8_;
  uVar15 = local_b30[6];
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  local_8a0 = vpinsrd_avx(auVar1,uVar15,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  auStack_890 = vpinsrd_avx(auVar1,uVar15,3);
  local_c40 = local_8a0._0_8_;
  uStack_c38 = local_8a0._8_8_;
  uStack_c30 = auStack_890._0_8_;
  uStack_c28 = auStack_890._8_8_;
  uVar16 = local_b30[0x1a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  local_860 = vpinsrd_avx(auVar1,uVar16,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  auStack_850 = vpinsrd_avx(auVar1,uVar16,3);
  local_c60 = local_860._0_8_;
  uStack_c58 = local_860._8_8_;
  uStack_c50 = auStack_850._0_8_;
  uStack_c48 = auStack_850._8_8_;
  uVar17 = local_b30[10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  local_820 = vpinsrd_avx(auVar1,uVar17,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  auStack_810 = vpinsrd_avx(auVar1,uVar17,3);
  local_c80 = local_820._0_8_;
  uStack_c78 = local_820._8_8_;
  uStack_c70 = auStack_810._0_8_;
  uStack_c68 = auStack_810._8_8_;
  uVar18 = local_b30[0x12];
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  local_7e0 = vpinsrd_avx(auVar1,uVar18,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  auStack_7d0 = vpinsrd_avx(auVar1,uVar18,3);
  local_ca0 = local_7e0._0_8_;
  uStack_c98 = local_7e0._8_8_;
  uStack_c90 = auStack_7d0._0_8_;
  uStack_c88 = auStack_7d0._8_8_;
  uVar19 = local_b30[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  local_7a0 = vpinsrd_avx(auVar1,uVar19,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  auStack_790 = vpinsrd_avx(auVar1,uVar19,3);
  local_cc0 = local_7a0._0_8_;
  uStack_cb8 = local_7a0._8_8_;
  uStack_cb0 = auStack_790._0_8_;
  uStack_ca8 = auStack_790._8_8_;
  out_shift_00 = -local_b30[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  local_760 = vpinsrd_avx(auVar1,out_shift_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  auStack_750 = vpinsrd_avx(auVar1,out_shift_00,3);
  local_ce0 = local_760._0_8_;
  uStack_cd8 = local_760._8_8_;
  uStack_cd0 = auStack_750._0_8_;
  uStack_cc8 = auStack_750._8_8_;
  bd_00 = -local_b30[0x2a];
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  local_720 = vpinsrd_avx(auVar1,bd_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  auStack_710 = vpinsrd_avx(auVar1,bd_00,3);
  local_d00 = local_720._0_8_;
  uStack_cf8 = local_720._8_8_;
  uStack_cf0 = auStack_710._0_8_;
  uStack_ce8 = auStack_710._8_8_;
  do_cols_00 = -local_b30[0x32];
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  local_6e0 = vpinsrd_avx(auVar1,do_cols_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  auStack_6d0 = vpinsrd_avx(auVar1,do_cols_00,3);
  local_d20 = local_6e0._0_8_;
  uStack_d18 = local_6e0._8_8_;
  uStack_d10 = auStack_6d0._0_8_;
  uStack_d08 = auStack_6d0._8_8_;
  uVar3 = -local_b30[0x22];
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  local_6a0 = vpinsrd_avx(auVar1,uVar3,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  auStack_690 = vpinsrd_avx(auVar1,uVar3,3);
  local_d40 = local_6a0._0_8_;
  uStack_d38 = local_6a0._8_8_;
  uStack_d30 = auStack_690._0_8_;
  uStack_d28 = auStack_690._8_8_;
  uVar20 = local_b30[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  local_660 = vpinsrd_avx(auVar1,uVar20,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  auStack_650 = vpinsrd_avx(auVar1,uVar20,3);
  local_d60 = local_660._0_8_;
  uStack_d58 = local_660._8_8_;
  uStack_d50 = auStack_650._0_8_;
  uStack_d48 = auStack_650._8_8_;
  uVar21 = local_b30[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  local_620 = vpinsrd_avx(auVar1,uVar21,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  auStack_610 = vpinsrd_avx(auVar1,uVar21,3);
  local_d80 = local_620._0_8_;
  uStack_d78 = local_620._8_8_;
  uStack_d70 = auStack_610._0_8_;
  uStack_d68 = auStack_610._8_8_;
  uVar22 = local_b30[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  local_5e0 = vpinsrd_avx(auVar1,uVar22,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  auStack_5d0 = vpinsrd_avx(auVar1,uVar22,3);
  local_da0 = local_5e0._0_8_;
  uStack_d98 = local_5e0._8_8_;
  uStack_d90 = auStack_5d0._0_8_;
  uStack_d88 = auStack_5d0._8_8_;
  uVar23 = local_b30[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  local_5a0 = vpinsrd_avx(auVar1,uVar23,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  auStack_590 = vpinsrd_avx(auVar1,uVar23,3);
  local_dc0 = local_5a0._0_8_;
  uStack_db8 = local_5a0._8_8_;
  uStack_db0 = auStack_590._0_8_;
  uStack_da8 = auStack_590._8_8_;
  uVar24 = local_b30[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  local_560 = vpinsrd_avx(auVar1,uVar24,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  auStack_550 = vpinsrd_avx(auVar1,uVar24,3);
  local_de0 = local_560._0_8_;
  uStack_dd8 = local_560._8_8_;
  uStack_dd0 = auStack_550._0_8_;
  uStack_dc8 = auStack_550._8_8_;
  local_ab8 = local_b30[4];
  auVar1 = vpinsrd_avx(ZEXT416(local_ab8),local_ab8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ab8,2);
  local_520 = vpinsrd_avx(auVar1,local_ab8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ab8),local_ab8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ab8,2);
  auStack_510 = vpinsrd_avx(auVar1,local_ab8,3);
  local_e00 = local_520._0_8_;
  uStack_df8 = local_520._8_8_;
  uStack_df0 = auStack_510._0_8_;
  uStack_de8 = auStack_510._8_8_;
  local_abc = -local_b30[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(local_abc),local_abc,1);
  auVar1 = vpinsrd_avx(auVar1,local_abc,2);
  local_4e0 = vpinsrd_avx(auVar1,local_abc,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_abc),local_abc,1);
  auVar1 = vpinsrd_avx(auVar1,local_abc,2);
  auStack_4d0 = vpinsrd_avx(auVar1,local_abc,3);
  local_e20 = local_4e0._0_8_;
  uStack_e18 = local_4e0._8_8_;
  uStack_e10 = auStack_4d0._0_8_;
  uStack_e08 = auStack_4d0._8_8_;
  local_ac0 = -local_b30[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(local_ac0),local_ac0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac0,2);
  local_4a0 = vpinsrd_avx(auVar1,local_ac0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ac0),local_ac0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac0,2);
  auStack_490 = vpinsrd_avx(auVar1,local_ac0,3);
  local_e40 = local_4a0._0_8_;
  uStack_e38 = local_4a0._8_8_;
  uStack_e30 = auStack_490._0_8_;
  uStack_e28 = auStack_490._8_8_;
  local_ac4 = local_b30[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(local_ac4),local_ac4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac4,2);
  local_460 = vpinsrd_avx(auVar1,local_ac4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ac4),local_ac4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac4,2);
  auStack_450 = vpinsrd_avx(auVar1,local_ac4,3);
  local_e60 = local_460._0_8_;
  uStack_e58 = local_460._8_8_;
  uStack_e50 = auStack_450._0_8_;
  uStack_e48 = auStack_450._8_8_;
  local_ac8 = local_b30[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(local_ac8),local_ac8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac8,2);
  local_420 = vpinsrd_avx(auVar1,local_ac8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ac8),local_ac8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ac8,2);
  auStack_410 = vpinsrd_avx(auVar1,local_ac8,3);
  local_e80 = local_420._0_8_;
  uStack_e78 = local_420._8_8_;
  uStack_e70 = auStack_410._0_8_;
  uStack_e68 = auStack_410._8_8_;
  local_acc = local_b30[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(local_acc),local_acc,1);
  auVar1 = vpinsrd_avx(auVar1,local_acc,2);
  local_3e0 = vpinsrd_avx(auVar1,local_acc,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_acc),local_acc,1);
  auVar1 = vpinsrd_avx(auVar1,local_acc,2);
  auStack_3d0 = vpinsrd_avx(auVar1,local_acc,3);
  local_ea0 = local_3e0._0_8_;
  lStack_e98 = local_3e0._8_8_;
  lStack_e90 = auStack_3d0._0_8_;
  lStack_e88 = auStack_3d0._8_8_;
  local_ad0 = local_b30[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_ad0),local_ad0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad0,2);
  local_3a0 = vpinsrd_avx(auVar1,local_ad0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ad0),local_ad0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad0,2);
  auStack_390 = vpinsrd_avx(auVar1,local_ad0,3);
  local_ec0 = local_3a0._0_8_;
  uStack_eb8 = local_3a0._8_8_;
  uStack_eb0 = auStack_390._0_8_;
  uStack_ea8 = auStack_390._8_8_;
  local_ad4 = -local_b30[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(local_ad4),local_ad4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad4,2);
  local_360 = vpinsrd_avx(auVar1,local_ad4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ad4),local_ad4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad4,2);
  auStack_350 = vpinsrd_avx(auVar1,local_ad4,3);
  local_ee0 = local_360._0_8_;
  uStack_ed8 = local_360._8_8_;
  uStack_ed0 = auStack_350._0_8_;
  uStack_ec8 = auStack_350._8_8_;
  local_ad8 = -local_b30[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_ad8),local_ad8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad8,2);
  local_320 = vpinsrd_avx(auVar1,local_ad8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ad8),local_ad8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ad8,2);
  auStack_310 = vpinsrd_avx(auVar1,local_ad8,3);
  local_f00 = local_320._0_8_;
  uStack_ef8 = local_320._8_8_;
  uStack_ef0 = auStack_310._0_8_;
  uStack_ee8 = auStack_310._8_8_;
  local_adc = -local_b30[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(local_adc),local_adc,1);
  auVar1 = vpinsrd_avx(auVar1,local_adc,2);
  local_2e0 = vpinsrd_avx(auVar1,local_adc,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_adc),local_adc,1);
  auVar1 = vpinsrd_avx(auVar1,local_adc,2);
  auStack_2d0 = vpinsrd_avx(auVar1,local_adc,3);
  local_f20 = local_2e0._0_8_;
  uStack_f18 = local_2e0._8_8_;
  uStack_f10 = auStack_2d0._0_8_;
  uStack_f08 = auStack_2d0._8_8_;
  local_ae0 = -local_b30[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(local_ae0),local_ae0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae0,2);
  local_2a0 = vpinsrd_avx(auVar1,local_ae0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ae0),local_ae0,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae0,2);
  auStack_290 = vpinsrd_avx(auVar1,local_ae0,3);
  local_f40 = local_2a0._0_8_;
  lStack_f38 = local_2a0._8_8_;
  lStack_f30 = auStack_290._0_8_;
  lStack_f28 = auStack_290._8_8_;
  local_ae4 = local_b30[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(local_ae4),local_ae4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae4,2);
  local_260 = vpinsrd_avx(auVar1,local_ae4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ae4),local_ae4,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae4,2);
  auStack_250 = vpinsrd_avx(auVar1,local_ae4,3);
  local_f60 = local_260._0_8_;
  uStack_f58 = local_260._8_8_;
  uStack_f50 = auStack_250._0_8_;
  uStack_f48 = auStack_250._8_8_;
  local_ae8 = -local_b30[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(local_ae8),local_ae8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae8,2);
  local_220 = vpinsrd_avx(auVar1,local_ae8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_ae8),local_ae8,1);
  auVar1 = vpinsrd_avx(auVar1,local_ae8,2);
  auStack_210 = vpinsrd_avx(auVar1,local_ae8,3);
  local_f80 = local_220._0_8_;
  uStack_f78 = local_220._8_8_;
  uStack_f70 = auStack_210._0_8_;
  uStack_f68 = auStack_210._8_8_;
  local_aec = local_b30[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_aec),local_aec,1);
  auVar1 = vpinsrd_avx(auVar1,local_aec,2);
  local_1e0 = vpinsrd_avx(auVar1,local_aec,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_aec),local_aec,1);
  auVar1 = vpinsrd_avx(auVar1,local_aec,2);
  auStack_1d0 = vpinsrd_avx(auVar1,local_aec,3);
  local_fa0 = local_1e0._0_8_;
  uStack_f98 = local_1e0._8_8_;
  uStack_f90 = auStack_1d0._0_8_;
  uStack_f88 = auStack_1d0._8_8_;
  local_af0 = -local_b30[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_af0),local_af0,1);
  auVar1 = vpinsrd_avx(auVar1,local_af0,2);
  local_1a0 = vpinsrd_avx(auVar1,local_af0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_af0),local_af0,1);
  auVar1 = vpinsrd_avx(auVar1,local_af0,2);
  auStack_190 = vpinsrd_avx(auVar1,local_af0,3);
  local_fc0 = local_1a0._0_8_;
  uStack_fb8 = local_1a0._8_8_;
  uStack_fb0 = auStack_190._0_8_;
  uStack_fa8 = auStack_190._8_8_;
  local_af4 = local_b30[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_af4),local_af4,1);
  auVar1 = vpinsrd_avx(auVar1,local_af4,2);
  local_160 = vpinsrd_avx(auVar1,local_af4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_af4),local_af4,1);
  auVar1 = vpinsrd_avx(auVar1,local_af4,2);
  auStack_150 = vpinsrd_avx(auVar1,local_af4,3);
  local_fe0 = local_160._0_8_;
  uStack_fd8 = local_160._8_8_;
  uStack_fd0 = auStack_150._0_8_;
  uStack_fc8 = auStack_150._8_8_;
  local_af8 = -local_b30[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_af8),local_af8,1);
  auVar1 = vpinsrd_avx(auVar1,local_af8,2);
  local_120 = vpinsrd_avx(auVar1,local_af8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_af8),local_af8,1);
  auVar1 = vpinsrd_avx(auVar1,local_af8,2);
  auStack_110 = vpinsrd_avx(auVar1,local_af8,3);
  local_1000 = local_120._0_8_;
  uStack_ff8 = local_120._8_8_;
  uStack_ff0 = auStack_110._0_8_;
  uStack_fe8 = auStack_110._8_8_;
  local_afc = 1 << ((char)local_b1c - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_afc),local_afc,1);
  auVar1 = vpinsrd_avx(auVar1,local_afc,2);
  auVar1 = vpinsrd_avx(auVar1,local_afc,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_afc),local_afc,1);
  auVar2 = vpinsrd_avx(auVar2,local_afc,2);
  auVar2 = vpinsrd_avx(auVar2,local_afc,3);
  local_e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  iVar7 = 8;
  if (local_b20 != 0) {
    iVar7 = 6;
  }
  if (local_b24 + iVar7 < 0x10) {
    iVar7 = 0x10;
  }
  else {
    iVar7 = 8;
    if (local_b20 != 0) {
      iVar7 = 6;
    }
    iVar7 = local_b24 + iVar7;
  }
  local_1024._0_1_ = (char)iVar7;
  local_b00 = -(1 << ((char)local_1024 - 1U & 0x1f));
  auVar1 = vpinsrd_avx(ZEXT416(local_b00),local_b00,1);
  auVar1 = vpinsrd_avx(auVar1,local_b00,2);
  local_a0 = vpinsrd_avx(auVar1,local_b00,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_b00),local_b00,1);
  auVar1 = vpinsrd_avx(auVar1,local_b00,2);
  auStack_90 = vpinsrd_avx(auVar1,local_b00,3);
  local_1060 = local_a0._0_8_;
  lStack_1058 = local_a0._8_8_;
  lStack_1050 = auStack_90._0_8_;
  lStack_1048 = auStack_90._8_8_;
  local_b04 = (1 << ((char)local_1024 - 1U & 0x1f)) - 1;
  auVar1 = vpinsrd_avx(ZEXT416(local_b04),local_b04,1);
  auVar1 = vpinsrd_avx(auVar1,local_b04,2);
  auVar1 = vpinsrd_avx(auVar1,local_b04,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_b04),local_b04,1);
  auVar2 = vpinsrd_avx(auVar2,local_b04,2);
  auVar2 = vpinsrd_avx(auVar2,local_b04,3);
  local_60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_1024 = iVar7;
  local_ab4 = uVar24;
  local_ab0 = uVar23;
  local_aac = uVar22;
  local_aa8 = uVar21;
  local_aa4 = uVar20;
  local_aa0 = uVar3;
  local_a9c = do_cols_00;
  local_a98 = bd_00;
  local_a94 = out_shift_00;
  local_a90 = uVar19;
  local_a8c = uVar18;
  local_a88 = uVar17;
  local_a84 = uVar16;
  local_a80 = uVar15;
  local_a7c = uVar14;
  local_a78 = uVar13;
  local_a74 = uVar12;
  local_a70 = uVar11;
  local_a6c = uVar10;
  local_a68 = uVar9;
  local_a64 = uVar8;
  local_a40 = uVar8;
  local_a3c = uVar8;
  local_a38 = uVar8;
  local_a34 = uVar8;
  local_a30 = uVar8;
  local_a2c = uVar8;
  local_a28 = uVar8;
  local_a24 = uVar8;
  local_a00 = uVar9;
  local_9fc = uVar9;
  local_9f8 = uVar9;
  local_9f4 = uVar9;
  local_9f0 = uVar9;
  local_9ec = uVar9;
  local_9e8 = uVar9;
  local_9e4 = uVar9;
  local_9c0 = uVar10;
  local_9bc = uVar10;
  local_9b8 = uVar10;
  local_9b4 = uVar10;
  local_9b0 = uVar10;
  local_9ac = uVar10;
  local_9a8 = uVar10;
  local_9a4 = uVar10;
  local_980 = uVar11;
  local_97c = uVar11;
  local_978 = uVar11;
  local_974 = uVar11;
  local_970 = uVar11;
  local_96c = uVar11;
  local_968 = uVar11;
  local_964 = uVar11;
  local_940 = uVar12;
  local_93c = uVar12;
  local_938 = uVar12;
  local_934 = uVar12;
  local_930 = uVar12;
  local_92c = uVar12;
  local_928 = uVar12;
  local_924 = uVar12;
  local_900 = uVar13;
  local_8fc = uVar13;
  local_8f8 = uVar13;
  local_8f4 = uVar13;
  local_8f0 = uVar13;
  local_8ec = uVar13;
  local_8e8 = uVar13;
  local_8e4 = uVar13;
  local_8c0 = uVar14;
  local_8bc = uVar14;
  local_8b8 = uVar14;
  local_8b4 = uVar14;
  local_8b0 = uVar14;
  local_8ac = uVar14;
  local_8a8 = uVar14;
  local_8a4 = uVar14;
  local_880 = uVar15;
  local_87c = uVar15;
  local_878 = uVar15;
  local_874 = uVar15;
  local_870 = uVar15;
  local_86c = uVar15;
  local_868 = uVar15;
  local_864 = uVar15;
  local_840 = uVar16;
  local_83c = uVar16;
  local_838 = uVar16;
  local_834 = uVar16;
  local_830 = uVar16;
  local_82c = uVar16;
  local_828 = uVar16;
  local_824 = uVar16;
  local_800 = uVar17;
  local_7fc = uVar17;
  local_7f8 = uVar17;
  local_7f4 = uVar17;
  local_7f0 = uVar17;
  local_7ec = uVar17;
  local_7e8 = uVar17;
  local_7e4 = uVar17;
  local_7c0 = uVar18;
  local_7bc = uVar18;
  local_7b8 = uVar18;
  local_7b4 = uVar18;
  local_7b0 = uVar18;
  local_7ac = uVar18;
  local_7a8 = uVar18;
  local_7a4 = uVar18;
  local_780 = uVar19;
  local_77c = uVar19;
  local_778 = uVar19;
  local_774 = uVar19;
  local_770 = uVar19;
  local_76c = uVar19;
  local_768 = uVar19;
  local_764 = uVar19;
  local_740 = out_shift_00;
  local_73c = out_shift_00;
  local_738 = out_shift_00;
  local_734 = out_shift_00;
  local_730 = out_shift_00;
  local_72c = out_shift_00;
  local_728 = out_shift_00;
  local_724 = out_shift_00;
  local_700 = bd_00;
  local_6fc = bd_00;
  local_6f8 = bd_00;
  local_6f4 = bd_00;
  local_6f0 = bd_00;
  local_6ec = bd_00;
  local_6e8 = bd_00;
  local_6e4 = bd_00;
  local_6c0 = do_cols_00;
  local_6bc = do_cols_00;
  local_6b8 = do_cols_00;
  local_6b4 = do_cols_00;
  local_6b0 = do_cols_00;
  local_6ac = do_cols_00;
  local_6a8 = do_cols_00;
  local_6a4 = do_cols_00;
  local_680 = uVar3;
  local_67c = uVar3;
  local_678 = uVar3;
  local_674 = uVar3;
  local_670 = uVar3;
  local_66c = uVar3;
  local_668 = uVar3;
  local_664 = uVar3;
  local_640 = uVar20;
  local_63c = uVar20;
  local_638 = uVar20;
  local_634 = uVar20;
  local_630 = uVar20;
  local_62c = uVar20;
  local_628 = uVar20;
  local_624 = uVar20;
  local_600 = uVar21;
  local_5fc = uVar21;
  local_5f8 = uVar21;
  local_5f4 = uVar21;
  local_5f0 = uVar21;
  local_5ec = uVar21;
  local_5e8 = uVar21;
  local_5e4 = uVar21;
  local_5c0 = uVar22;
  local_5bc = uVar22;
  local_5b8 = uVar22;
  local_5b4 = uVar22;
  local_5b0 = uVar22;
  local_5ac = uVar22;
  local_5a8 = uVar22;
  local_5a4 = uVar22;
  local_580 = uVar23;
  local_57c = uVar23;
  local_578 = uVar23;
  local_574 = uVar23;
  local_570 = uVar23;
  local_56c = uVar23;
  local_568 = uVar23;
  local_564 = uVar23;
  local_540 = uVar24;
  local_53c = uVar24;
  local_538 = uVar24;
  local_534 = uVar24;
  local_530 = uVar24;
  local_52c = uVar24;
  local_528 = uVar24;
  local_524 = uVar24;
  local_500 = local_ab8;
  local_4fc = local_ab8;
  local_4f8 = local_ab8;
  local_4f4 = local_ab8;
  local_4f0 = local_ab8;
  local_4ec = local_ab8;
  local_4e8 = local_ab8;
  local_4e4 = local_ab8;
  local_4c0 = local_abc;
  local_4bc = local_abc;
  local_4b8 = local_abc;
  local_4b4 = local_abc;
  local_4b0 = local_abc;
  local_4ac = local_abc;
  local_4a8 = local_abc;
  local_4a4 = local_abc;
  local_480 = local_ac0;
  local_47c = local_ac0;
  local_478 = local_ac0;
  local_474 = local_ac0;
  local_470 = local_ac0;
  local_46c = local_ac0;
  local_468 = local_ac0;
  local_464 = local_ac0;
  local_440 = local_ac4;
  local_43c = local_ac4;
  local_438 = local_ac4;
  local_434 = local_ac4;
  local_430 = local_ac4;
  local_42c = local_ac4;
  local_428 = local_ac4;
  local_424 = local_ac4;
  local_400 = local_ac8;
  local_3fc = local_ac8;
  local_3f8 = local_ac8;
  local_3f4 = local_ac8;
  local_3f0 = local_ac8;
  local_3ec = local_ac8;
  local_3e8 = local_ac8;
  local_3e4 = local_ac8;
  local_3c0 = local_acc;
  local_3bc = local_acc;
  local_3b8 = local_acc;
  local_3b4 = local_acc;
  local_3b0 = local_acc;
  local_3ac = local_acc;
  local_3a8 = local_acc;
  local_3a4 = local_acc;
  local_380 = local_ad0;
  local_37c = local_ad0;
  local_378 = local_ad0;
  local_374 = local_ad0;
  local_370 = local_ad0;
  local_36c = local_ad0;
  local_368 = local_ad0;
  local_364 = local_ad0;
  local_340 = local_ad4;
  local_33c = local_ad4;
  local_338 = local_ad4;
  local_334 = local_ad4;
  local_330 = local_ad4;
  local_32c = local_ad4;
  local_328 = local_ad4;
  local_324 = local_ad4;
  local_300 = local_ad8;
  local_2fc = local_ad8;
  local_2f8 = local_ad8;
  local_2f4 = local_ad8;
  local_2f0 = local_ad8;
  local_2ec = local_ad8;
  local_2e8 = local_ad8;
  local_2e4 = local_ad8;
  local_2c0 = local_adc;
  local_2bc = local_adc;
  local_2b8 = local_adc;
  local_2b4 = local_adc;
  local_2b0 = local_adc;
  local_2ac = local_adc;
  local_2a8 = local_adc;
  local_2a4 = local_adc;
  local_280 = local_ae0;
  local_27c = local_ae0;
  local_278 = local_ae0;
  local_274 = local_ae0;
  local_270 = local_ae0;
  local_26c = local_ae0;
  local_268 = local_ae0;
  local_264 = local_ae0;
  local_240 = local_ae4;
  local_23c = local_ae4;
  local_238 = local_ae4;
  local_234 = local_ae4;
  local_230 = local_ae4;
  local_22c = local_ae4;
  local_228 = local_ae4;
  local_224 = local_ae4;
  local_200 = local_ae8;
  local_1fc = local_ae8;
  local_1f8 = local_ae8;
  local_1f4 = local_ae8;
  local_1f0 = local_ae8;
  local_1ec = local_ae8;
  local_1e8 = local_ae8;
  local_1e4 = local_ae8;
  local_1c0 = local_aec;
  local_1bc = local_aec;
  local_1b8 = local_aec;
  local_1b4 = local_aec;
  local_1b0 = local_aec;
  local_1ac = local_aec;
  local_1a8 = local_aec;
  local_1a4 = local_aec;
  local_180 = local_af0;
  local_17c = local_af0;
  local_178 = local_af0;
  local_174 = local_af0;
  local_170 = local_af0;
  local_16c = local_af0;
  local_168 = local_af0;
  local_164 = local_af0;
  local_140 = local_af4;
  local_13c = local_af4;
  local_138 = local_af4;
  local_134 = local_af4;
  local_130 = local_af4;
  local_12c = local_af4;
  local_128 = local_af4;
  local_124 = local_af4;
  local_100 = local_af8;
  local_fc = local_af8;
  local_f8 = local_af8;
  local_f4 = local_af8;
  local_f0 = local_af8;
  local_ec = local_af8;
  local_e8 = local_af8;
  local_e4 = local_af8;
  local_c0 = local_afc;
  local_bc = local_afc;
  local_b8 = local_afc;
  local_b4 = local_afc;
  local_b0 = local_afc;
  local_ac = local_afc;
  local_a8 = local_afc;
  local_a4 = local_afc;
  local_80 = local_b00;
  local_7c = local_b00;
  local_78 = local_b00;
  local_74 = local_b00;
  local_70 = local_b00;
  local_6c = local_b00;
  local_68 = local_b00;
  local_64 = local_b00;
  local_40 = local_b04;
  local_3c = local_b04;
  local_38 = local_b04;
  local_34 = local_b04;
  local_30 = local_b04;
  local_2c = local_b04;
  local_28 = local_b04;
  local_24 = local_b04;
  local_1020 = local_e0._0_16_;
  auStack_1010 = local_e0._16_16_;
  local_1080 = local_60._0_16_;
  auStack_1070 = local_60._16_16_;
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  in0[0]._4_4_ = do_cols_00;
  in0[0]._0_4_ = bd_00;
  in0[1]._0_4_ = uVar3;
  in0[1]._4_4_ = uVar20;
  in0[2]._0_4_ = uVar21;
  in0[2]._4_4_ = uVar22;
  in0[3]._0_4_ = uVar23;
  in0[3]._4_4_ = uVar24;
  in1[0]._4_4_ = uVar14;
  in1[0]._0_4_ = uVar13;
  in1[1]._0_4_ = uVar15;
  in1[1]._4_4_ = uVar16;
  in1[2]._0_4_ = uVar17;
  in1[2]._4_4_ = uVar18;
  in1[3]._0_4_ = uVar19;
  in1[3]._4_4_ = out_shift_00;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_00[0]._4_4_ = do_cols_00;
  in0_00[0]._0_4_ = bd_00;
  in0_00[1]._0_4_ = uVar3;
  in0_00[1]._4_4_ = uVar20;
  in0_00[2]._0_4_ = uVar21;
  in0_00[2]._4_4_ = uVar22;
  in0_00[3]._0_4_ = uVar23;
  in0_00[3]._4_4_ = uVar24;
  in1_00[0]._4_4_ = uVar14;
  in1_00[0]._0_4_ = uVar13;
  in1_00[1]._0_4_ = uVar15;
  in1_00[1]._4_4_ = uVar16;
  in1_00[2]._0_4_ = uVar17;
  in1_00[2]._4_4_ = uVar18;
  in1_00[3]._0_4_ = uVar19;
  in1_00[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_01[0]._4_4_ = do_cols_00;
  in0_01[0]._0_4_ = bd_00;
  in0_01[1]._0_4_ = uVar3;
  in0_01[1]._4_4_ = uVar20;
  in0_01[2]._0_4_ = uVar21;
  in0_01[2]._4_4_ = uVar22;
  in0_01[3]._0_4_ = uVar23;
  in0_01[3]._4_4_ = uVar24;
  in1_01[0]._4_4_ = uVar14;
  in1_01[0]._0_4_ = uVar13;
  in1_01[1]._0_4_ = uVar15;
  in1_01[1]._4_4_ = uVar16;
  in1_01[2]._0_4_ = uVar17;
  in1_01[2]._4_4_ = uVar18;
  in1_01[3]._0_4_ = uVar19;
  in1_01[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_02[0]._4_4_ = do_cols_00;
  in0_02[0]._0_4_ = bd_00;
  in0_02[1]._0_4_ = uVar3;
  in0_02[1]._4_4_ = uVar20;
  in0_02[2]._0_4_ = uVar21;
  in0_02[2]._4_4_ = uVar22;
  in0_02[3]._0_4_ = uVar23;
  in0_02[3]._4_4_ = uVar24;
  in1_02[0]._4_4_ = uVar14;
  in1_02[0]._0_4_ = uVar13;
  in1_02[1]._0_4_ = uVar15;
  in1_02[1]._4_4_ = uVar16;
  in1_02[2]._0_4_ = uVar17;
  in1_02[2]._4_4_ = uVar18;
  in1_02[3]._0_4_ = uVar19;
  in1_02[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_03[0]._4_4_ = do_cols_00;
  in0_03[0]._0_4_ = bd_00;
  in0_03[1]._0_4_ = uVar3;
  in0_03[1]._4_4_ = uVar20;
  in0_03[2]._0_4_ = uVar21;
  in0_03[2]._4_4_ = uVar22;
  in0_03[3]._0_4_ = uVar23;
  in0_03[3]._4_4_ = uVar24;
  in1_03[0]._4_4_ = uVar14;
  in1_03[0]._0_4_ = uVar13;
  in1_03[1]._0_4_ = uVar15;
  in1_03[1]._4_4_ = uVar16;
  in1_03[2]._0_4_ = uVar17;
  in1_03[2]._4_4_ = uVar18;
  in1_03[3]._0_4_ = uVar19;
  in1_03[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_04[0]._4_4_ = do_cols_00;
  in0_04[0]._0_4_ = bd_00;
  in0_04[1]._0_4_ = uVar3;
  in0_04[1]._4_4_ = uVar20;
  in0_04[2]._0_4_ = uVar21;
  in0_04[2]._4_4_ = uVar22;
  in0_04[3]._0_4_ = uVar23;
  in0_04[3]._4_4_ = uVar24;
  in1_04[0]._4_4_ = uVar14;
  in1_04[0]._0_4_ = uVar13;
  in1_04[1]._0_4_ = uVar15;
  in1_04[1]._4_4_ = uVar16;
  in1_04[2]._0_4_ = uVar17;
  in1_04[2]._4_4_ = uVar18;
  in1_04[3]._0_4_ = uVar19;
  in1_04[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_05[0]._4_4_ = do_cols_00;
  in0_05[0]._0_4_ = bd_00;
  in0_05[1]._0_4_ = uVar3;
  in0_05[1]._4_4_ = uVar20;
  in0_05[2]._0_4_ = uVar21;
  in0_05[2]._4_4_ = uVar22;
  in0_05[3]._0_4_ = uVar23;
  in0_05[3]._4_4_ = uVar24;
  in1_05[0]._4_4_ = uVar14;
  in1_05[0]._0_4_ = uVar13;
  in1_05[1]._0_4_ = uVar15;
  in1_05[1]._4_4_ = uVar16;
  in1_05[2]._0_4_ = uVar17;
  in1_05[2]._4_4_ = uVar18;
  in1_05[3]._0_4_ = uVar19;
  in1_05[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_06[0]._4_4_ = do_cols_00;
  in0_06[0]._0_4_ = bd_00;
  in0_06[1]._0_4_ = uVar3;
  in0_06[1]._4_4_ = uVar20;
  in0_06[2]._0_4_ = uVar21;
  in0_06[2]._4_4_ = uVar22;
  in0_06[3]._0_4_ = uVar23;
  in0_06[3]._4_4_ = uVar24;
  in1_06[0]._4_4_ = uVar14;
  in1_06[0]._0_4_ = uVar13;
  in1_06[1]._0_4_ = uVar15;
  in1_06[1]._4_4_ = uVar16;
  in1_06[2]._0_4_ = uVar17;
  in1_06[2]._4_4_ = uVar18;
  in1_06[3]._0_4_ = uVar19;
  in1_06[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar6);
  in0_07[0]._4_4_ = do_cols_00;
  in0_07[0]._0_4_ = bd_00;
  in0_07[1]._0_4_ = uVar3;
  in0_07[1]._4_4_ = uVar20;
  in0_07[2]._0_4_ = uVar21;
  in0_07[2]._4_4_ = uVar22;
  in0_07[3]._0_4_ = uVar23;
  in0_07[3]._4_4_ = uVar24;
  in1_07[0]._4_4_ = uVar14;
  in1_07[0]._0_4_ = uVar13;
  in1_07[1]._0_4_ = uVar15;
  in1_07[1]._4_4_ = uVar16;
  in1_07[2]._0_4_ = uVar17;
  in1_07[2]._4_4_ = uVar18;
  in1_07[3]._0_4_ = uVar19;
  in1_07[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_08[0]._4_4_ = do_cols_00;
  in0_08[0]._0_4_ = bd_00;
  in0_08[1]._0_4_ = uVar3;
  in0_08[1]._4_4_ = uVar20;
  in0_08[2]._0_4_ = uVar21;
  in0_08[2]._4_4_ = uVar22;
  in0_08[3]._0_4_ = uVar23;
  in0_08[3]._4_4_ = uVar24;
  in1_08[0]._4_4_ = uVar14;
  in1_08[0]._0_4_ = uVar13;
  in1_08[1]._0_4_ = uVar15;
  in1_08[1]._4_4_ = uVar16;
  in1_08[2]._0_4_ = uVar17;
  in1_08[2]._4_4_ = uVar18;
  in1_08[3]._0_4_ = uVar19;
  in1_08[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_09[0]._4_4_ = do_cols_00;
  in0_09[0]._0_4_ = bd_00;
  in0_09[1]._0_4_ = uVar3;
  in0_09[1]._4_4_ = uVar20;
  in0_09[2]._0_4_ = uVar21;
  in0_09[2]._4_4_ = uVar22;
  in0_09[3]._0_4_ = uVar23;
  in0_09[3]._4_4_ = uVar24;
  in1_09[0]._4_4_ = uVar14;
  in1_09[0]._0_4_ = uVar13;
  in1_09[1]._0_4_ = uVar15;
  in1_09[1]._4_4_ = uVar16;
  in1_09[2]._0_4_ = uVar17;
  in1_09[2]._4_4_ = uVar18;
  in1_09[3]._0_4_ = uVar19;
  in1_09[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_10[0]._4_4_ = do_cols_00;
  in0_10[0]._0_4_ = bd_00;
  in0_10[1]._0_4_ = uVar3;
  in0_10[1]._4_4_ = uVar20;
  in0_10[2]._0_4_ = uVar21;
  in0_10[2]._4_4_ = uVar22;
  in0_10[3]._0_4_ = uVar23;
  in0_10[3]._4_4_ = uVar24;
  in1_10[0]._4_4_ = uVar14;
  in1_10[0]._0_4_ = uVar13;
  in1_10[1]._0_4_ = uVar15;
  in1_10[1]._4_4_ = uVar16;
  in1_10[2]._0_4_ = uVar17;
  in1_10[2]._4_4_ = uVar18;
  in1_10[3]._0_4_ = uVar19;
  in1_10[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  palVar4 = (__m256i *)&local_f40;
  cospim24_00 = (__m256i *)local_1020;
  iVar6 = local_b1c;
  idct32_stage4_avx2((__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
                     (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8,
                     (__m256i *)&local_ea0,palVar4,cospim24_00,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,local_b1c),
                     in_stack_ffffffffffffeac8);
  uVar5 = (undefined4)((ulong)palVar4 >> 0x20);
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,iVar6),
                  (int)((ulong)cospim24_00 >> 0x20));
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,iVar6),
                  (int)((ulong)cospim24_00 >> 0x20));
  half_btf_0_avx2(in_stack_ffffffffffffead0,
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeacc,in_stack_ffffffffffffeac8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,iVar6),
                  (int)((ulong)cospim24_00 >> 0x20));
  iVar6 = (int)cospim24_00;
  in0_11[0]._4_4_ = do_cols_00;
  in0_11[0]._0_4_ = bd_00;
  in0_11[1]._0_4_ = uVar3;
  in0_11[1]._4_4_ = uVar20;
  in0_11[2]._0_4_ = uVar21;
  in0_11[2]._4_4_ = uVar22;
  in0_11[3]._0_4_ = uVar23;
  in0_11[3]._4_4_ = uVar24;
  in1_11[0]._4_4_ = uVar14;
  in1_11[0]._0_4_ = uVar13;
  in1_11[1]._0_4_ = uVar15;
  in1_11[1]._4_4_ = uVar16;
  in1_11[2]._0_4_ = uVar17;
  in1_11[2]._4_4_ = uVar18;
  in1_11[3]._0_4_ = uVar19;
  in1_11[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_12[0]._4_4_ = do_cols_00;
  in0_12[0]._0_4_ = bd_00;
  in0_12[1]._0_4_ = uVar3;
  in0_12[1]._4_4_ = uVar20;
  in0_12[2]._0_4_ = uVar21;
  in0_12[2]._4_4_ = uVar22;
  in0_12[3]._0_4_ = uVar23;
  in0_12[3]._4_4_ = uVar24;
  in1_12[0]._4_4_ = uVar14;
  in1_12[0]._0_4_ = uVar13;
  in1_12[1]._0_4_ = uVar15;
  in1_12[1]._4_4_ = uVar16;
  in1_12[2]._0_4_ = uVar17;
  in1_12[2]._4_4_ = uVar18;
  in1_12[3]._0_4_ = uVar19;
  in1_12[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  idct32_stage5_avx2((__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
                     (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8,
                     (__m256i *)local_1020,(__m256i *)CONCAT44(uVar5,local_b1c),iVar6);
  in0_13[0]._4_4_ = do_cols_00;
  in0_13[0]._0_4_ = bd_00;
  in0_13[1]._0_4_ = uVar3;
  in0_13[1]._4_4_ = uVar20;
  in0_13[2]._0_4_ = uVar21;
  in0_13[2]._4_4_ = uVar22;
  in0_13[3]._0_4_ = uVar23;
  in0_13[3]._4_4_ = uVar24;
  in1_13[0]._4_4_ = uVar14;
  in1_13[0]._0_4_ = uVar13;
  in1_13[1]._0_4_ = uVar15;
  in1_13[1]._4_4_ = uVar16;
  in1_13[2]._0_4_ = uVar17;
  in1_13[2]._4_4_ = uVar18;
  in1_13[3]._0_4_ = uVar19;
  in1_13[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  in0_14[0]._4_4_ = do_cols_00;
  in0_14[0]._0_4_ = bd_00;
  in0_14[1]._0_4_ = uVar3;
  in0_14[1]._4_4_ = uVar20;
  in0_14[2]._0_4_ = uVar21;
  in0_14[2]._4_4_ = uVar22;
  in0_14[3]._0_4_ = uVar23;
  in0_14[3]._4_4_ = uVar24;
  in1_14[0]._4_4_ = uVar14;
  in1_14[0]._0_4_ = uVar13;
  in1_14[1]._0_4_ = uVar15;
  in1_14[1]._4_4_ = uVar16;
  in1_14[2]._0_4_ = uVar17;
  in1_14[2]._4_4_ = uVar18;
  in1_14[3]._0_4_ = uVar19;
  in1_14[3]._4_4_ = out_shift_00;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
              (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8);
  palVar4 = (__m256i *)&local_1060;
  idct32_stage6_avx2((__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
                     (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8,palVar4,
                     (__m256i *)local_1080,(__m256i *)local_1020,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffeac4,local_b1c),
                     in_stack_ffffffffffffeac8);
  idct32_stage7_avx2((__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
                     (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8,(int)palVar4);
  idct32_stage8_avx2((__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)CONCAT44(uVar12,uVar11),(__m256i *)CONCAT44(uVar10,uVar9),
                     (__m256i *)CONCAT44(uVar8,iVar7),in_stack_ffffffffffffead8,(int)palVar4);
  idct32_stage9_avx2((__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar3),do_cols_00
                     ,bd_00,out_shift_00,(__m256i *)CONCAT44(uVar18,uVar17),palVar4);
  return;
}

Assistant:

static void idct32_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[2] = in[8];
    bf1[4] = in[4];
    bf1[6] = in[12];
    bf1[8] = in[2];
    bf1[10] = in[10];
    bf1[12] = in[6];
    bf1[14] = in[14];
    bf1[16] = in[1];
    bf1[18] = in[9];
    bf1[20] = in[5];
    bf1[22] = in[13];
    bf1[24] = in[3];
    bf1[26] = in[11];
    bf1[28] = in[7];
    bf1[30] = in[15];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[17] = half_btf_0_avx2(&cospim34, &bf1[30], &rounding, bit);
    bf1[30] = half_btf_0_avx2(&cospi30, &bf1[30], &rounding, bit);
    bf1[29] = half_btf_0_avx2(&cospi18, &bf1[18], &rounding, bit);
    bf1[18] = half_btf_0_avx2(&cospi46, &bf1[18], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[21] = half_btf_0_avx2(&cospim42, &bf1[26], &rounding, bit);
    bf1[26] = half_btf_0_avx2(&cospi22, &bf1[26], &rounding, bit);
    bf1[25] = half_btf_0_avx2(&cospi26, &bf1[22], &rounding, bit);
    bf1[22] = half_btf_0_avx2(&cospi38, &bf1[22], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);
    bf1[9] = half_btf_0_avx2(&cospim36, &bf1[14], &rounding, bit);
    bf1[14] = half_btf_0_avx2(&cospi28, &bf1[14], &rounding, bit);
    bf1[13] = half_btf_0_avx2(&cospi20, &bf1[10], &rounding, bit);
    bf1[10] = half_btf_0_avx2(&cospi44, &bf1[10], &rounding, bit);
    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);

    addsub_avx2(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);
    bf1[5] = half_btf_0_avx2(&cospim40, &bf1[6], &rounding, bit);
    bf1[6] = half_btf_0_avx2(&cospi24, &bf1[6], &rounding, bit);

    addsub_avx2(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[3] = half_btf_0_avx2(&cospi16, &bf1[2], &rounding, bit);
    bf1[2] = half_btf_0_avx2(&cospi48, &bf1[2], &rounding, bit);

    addsub_avx2(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    addsub_avx2(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}